

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::resolve_tags(Tree *this)

{
  long lVar1;
  size_t sVar2;
  
  if (this->m_size == 0) {
    return;
  }
  lVar1 = 0x68;
  while ((*(long *)((long)this->m_tag_directives + lVar1 + -0x60) != 0 &&
         (*(long *)((long)this->m_tag_directives + lVar1 + -0x68) != 0))) {
    lVar1 = lVar1 + 0x28;
    if (lVar1 == 0x108) {
LAB_001c6b67:
      sVar2 = root_id(this);
      sVar2 = anon_unknown_0::_count_resolved_tags_size(this,sVar2);
      if (sVar2 != 0) {
        reserve_arena(this,sVar2 + this->m_arena_pos);
      }
      sVar2 = root_id(this);
      anon_unknown_0::_resolve_tags(this,sVar2);
      return;
    }
  }
  if (lVar1 == 0x68) {
    return;
  }
  goto LAB_001c6b67;
}

Assistant:

inline bool   empty() const { return m_size == 0; }